

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O2

ParameterPoint *
anurbs::PointOnCurveProjection<3L>::project_to_line
          (ParameterPoint *__return_storage_ptr__,Vector *point,Vector *a,Vector *b,double *t0,
          double *t1)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double do2ptr;
  Vector dif;
  Vector o;
  Vector o2pt;
  Vector r;
  ResScalar local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  Matrix<double,_1,_3,_1,_1,_3> local_c8;
  undefined1 local_b0 [24];
  double local_98;
  type local_80;
  PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> local_60 [24];
  PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> local_48 [24];
  
  local_b0._0_8_ = b;
  local_b0._8_8_ = a;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_e8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)local_b0);
  dVar1 = local_d8 * local_d8 + dStack_e0 * dStack_e0 + local_e8 * local_e8;
  if (1e-14 <= dVar1) {
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
           [2];
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
           [0];
    local_c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
           [1];
    local_80.m_lhs = (LhsNested)(1.0 / dVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator*
              ((type *)local_b0,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_e8,
               (double *)&local_80);
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>>
              (local_48,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                         *)local_b0);
    local_b0._0_8_ = point;
    local_b0._8_8_ = &local_c8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
              (local_60,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                         *)local_b0);
    local_f0 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_60,
                     (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_48);
    if (0.0 <= local_f0) {
      if (local_f0 <= 1.0) {
        dVar1 = *t0;
        dVar4 = (*t1 - dVar1) * local_f0;
        Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator*
                  (&local_80,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_e8,&local_f0);
        local_b0._0_8_ = &local_c8;
        local_b0._8_8_ = local_80.m_lhs;
        local_98 = local_80.m_rhs.m_functor.m_other;
        Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)
                   &__return_storage_ptr__->second,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
                    *)local_b0);
        __return_storage_ptr__->first = dVar4 + dVar1;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->first = *t1;
      dVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
              array[1];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[0] =
           (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
           [0];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[1] = dVar1;
      dVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
              array[2];
      goto LAB_00197ee7;
    }
    uVar2 = SUB84(*t0,0);
    uVar3 = (undefined4)((ulong)*t0 >> 0x20);
  }
  else {
    uVar2 = SUB84(*t0,0);
    uVar3 = (undefined4)((ulong)*t0 >> 0x20);
  }
  __return_storage_ptr__->first = (double)CONCAT44(uVar3,uVar2);
  dVar1 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] =
       (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[0];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[1] = dVar1;
  dVar1 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
LAB_00197ee7:
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[2] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

static ParameterPoint project_to_line(const Vector& point, const Vector& a, const Vector& b, const double& t0, const double& t1)
    {
        const Vector dif = b - a;
        const double l = squared_norm(dif);

        if (l < 1e-14) {
            return {t0, a};
        }

        const Vector o = a;
        const Vector r = dif * (1.0 / l);
        const Vector o2pt = point - o;
        const double do2ptr = dot(o2pt, r);

        if (do2ptr < 0) {
            return {t0, a};
        }

        if (do2ptr > 1) {
            return {t1, b};
        }

        const double t = t0 + (t1 - t0) * do2ptr;
        const Vector closest_point = o + dif * do2ptr;

        return {t, closest_point};
    }